

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  long lVar1;
  long lVar2;
  dasm_State **ppdVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  long *plVar7;
  BuildCtx *pBVar8;
  int *piVar9;
  sbyte sVar10;
  byte *pbVar11;
  uint *puVar12;
  BuildCtx *in_RSI;
  long *in_RDI;
  int fill;
  int idx;
  int *pb_1;
  int *pb;
  int shrink;
  uchar *ex;
  int t;
  int mrm;
  uchar *mm;
  int n;
  int action;
  uchar *mark;
  dasm_ActList p;
  int *endb;
  int *b;
  dasm_Section *sec;
  int secnum;
  uchar *cp;
  uchar *base;
  dasm_State *D;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  BuildCtx *in_stack_ffffffffffffff40;
  uint local_b4;
  uint local_a4;
  BuildCtx *local_80;
  uint local_68;
  byte local_64;
  BuildCtx *local_60;
  byte *local_58;
  uint *local_48;
  int local_34;
  BuildCtx *local_30;
  int local_4;
  
  lVar1 = *in_RDI;
  local_34 = 0;
  local_30 = in_RSI;
  do {
    if (*(int *)(lVar1 + 0x48) <= local_34) {
      if ((BuildCtx *)((long)&in_RSI->D + *(long *)(lVar1 + 0x40)) == local_30) {
        local_4 = 0;
      }
      else {
        local_4 = 0x2000000;
      }
      return local_4;
    }
    plVar7 = (long *)(lVar1 + 0x50 + (long)local_34 * 0x28);
    local_48 = (uint *)plVar7[1];
    lVar2 = *plVar7;
    lVar4 = plVar7[3];
LAB_00106bb7:
    if (local_48 != (uint *)(lVar2 + (long)(int)lVar4 * 4)) {
      local_60 = (BuildCtx *)0x0;
      local_58 = (byte *)(*(long *)(lVar1 + 8) + (long)(int)*local_48);
      local_48 = local_48 + 1;
LAB_00106c01:
      while( true ) {
        pbVar11 = local_58 + 1;
        local_64 = *local_58;
        uVar6 = (uint)local_64;
        if ((uVar6 < 0xe9) || (0xfa < uVar6)) {
          local_a4 = 0;
        }
        else {
          local_a4 = *local_48;
          local_48 = local_48 + 1;
        }
        local_68 = local_a4;
        if (uVar6 - 0xe9 < 0x17) break;
LAB_00107427:
        local_58 = pbVar11;
        *(byte *)&local_30->D = local_64;
        local_30 = (BuildCtx *)((long)&local_30->D + 1);
      }
      switch(uVar6) {
      case 0xe9:
        if (local_60 == (BuildCtx *)0x0) {
          local_60 = local_30;
        }
        pBVar8 = local_60;
        if ((*pbVar11 != 0xef) && (*pbVar11 != 0xee)) {
          local_60 = (BuildCtx *)0x0;
        }
        if (local_a4 == 0) {
          bVar5 = *(byte *)((long)&pBVar8[-1].reloc[199].type + 3) & 7;
          if (bVar5 == 4) {
            bVar5 = *(byte *)&pBVar8->D & 7;
          }
          if (bVar5 != 5) {
            *(char *)((long)&pBVar8[-1].reloc[199].type + 3) =
                 *(char *)((long)&pBVar8[-1].reloc[199].type + 3) + -0x80;
            local_58 = pbVar11;
            goto LAB_00106c01;
          }
        }
        local_58 = pbVar11;
        if ((local_a4 + 0x80 & 0xffffff00) == 0) {
          *(char *)((long)&pBVar8[-1].reloc[199].type + 3) =
               *(char *)((long)&pBVar8[-1].reloc[199].type + 3) + -0x40;
          goto switchD_00106c88_caseD_ea;
        }
        break;
      default:
switchD_00106c88_caseD_ea:
        local_58 = pbVar11;
        goto LAB_00106d48;
      case 0xec:
switchD_00106c88_caseD_ec:
        ppdVar3 = &local_30->D;
        *(char *)&local_30->D = (char)local_a4;
        local_30 = (BuildCtx *)((long)&local_30->D + 2);
        *(char *)((long)ppdVar3 + 1) = (char)(local_a4 >> 8);
        local_58 = pbVar11;
        goto LAB_00106c01;
      case 0xed:
        goto switchD_00106c88_caseD_ed;
      case 0xee:
        if ((local_a4 + 0x80 & 0xffffff00) != 0) {
          local_60 = (BuildCtx *)0x0;
          goto switchD_00106c88_caseD_ec;
        }
LAB_00106d81:
        if (local_60 == (BuildCtx *)0x0) {
          local_60 = local_30;
        }
        *(char *)((long)&local_60[-1].reloc[199].type + 2) =
             *(char *)((long)&local_60[-1].reloc[199].type + 2) + '\x02';
        local_60 = (BuildCtx *)0x0;
        local_58 = pbVar11;
LAB_00106d48:
        *(char *)&local_30->D = (char)local_68;
        local_30 = (BuildCtx *)((long)&local_30->D + 1);
        goto LAB_00106c01;
      case 0xef:
        if ((local_a4 + 0x80 & 0xffffff00) == 0) goto LAB_00106d81;
        local_60 = (BuildCtx *)0x0;
        goto switchD_00106c88_caseD_ed;
      case 0xf0:
        uVar6 = (uint)*pbVar11;
        local_80 = (BuildCtx *)((long)local_30 - (long)(int)(uVar6 & 7));
        if (((local_a4 & 8) == 0) || (0x9f < uVar6)) {
          if ((local_a4 & 0x10) != 0) {
            if (((ulong)local_80->D & 0x80) != 0) {
              *(undefined1 *)&local_80->D = 0xc5;
              *(byte *)((long)&local_80->D + 1) =
                   *(byte *)((long)&local_80->D + 1) & 0x80 | *(byte *)((long)&local_80->D + 2);
              local_80 = (BuildCtx *)((long)&local_80->D + 2);
            }
            while (pBVar8 = (BuildCtx *)((long)&local_80->D + 1), pBVar8 < local_30) {
              *(undefined1 *)&local_80->D = *(undefined1 *)&pBVar8->D;
              local_80 = pBVar8;
            }
            if (local_60 != (BuildCtx *)0x0) {
              local_60 = (BuildCtx *)((long)&local_60[-1].reloc[199].type + 3);
            }
            local_30 = (BuildCtx *)((long)&local_30[-1].reloc[199].type + 3);
            local_68 = local_a4 & 7;
          }
        }
        else {
          sVar10 = (sbyte)((int)uVar6 >> 6);
          if (((ulong)local_80->D & 0x80) == 0) {
            *(byte *)&local_80->D = *(byte *)&local_80->D ^ (byte)(1 << sVar10);
          }
          else {
            *(byte *)((long)&local_80->D + 1) =
                 *(byte *)((long)&local_80->D + 1) ^ (byte)(0x20 << sVar10);
          }
          local_68 = local_a4 & 7;
        }
        if (uVar6 < 0xc0) {
          if (uVar6 < 0x40) {
            if ((local_68 == 4) && (uVar6 < 0x20)) {
              *(byte *)((long)&local_30[-1].reloc[199].type + 3) =
                   *(byte *)((long)&local_30[-1].reloc[199].type + 3) ^ 4;
              *(undefined1 *)&local_30->D = 0x20;
              local_30 = (BuildCtx *)((long)&local_30->D + 1);
            }
          }
          else {
            local_68 = local_68 << 3;
          }
        }
        else {
          local_68._0_1_ = (byte)(local_68 << 4);
        }
        *(byte *)((long)&local_30[-1].reloc[199].type + 3) =
             *(byte *)((long)&local_30[-1].reloc[199].type + 3) ^ (byte)local_68;
        local_58 = local_58 + 2;
        goto LAB_00106c01;
      case 0xf1:
        local_58 = local_58 + 2;
        bVar5 = *pbVar11;
        while (local_68 != 0) {
          *(byte *)&local_30->D = bVar5;
          local_68 = local_68 - 1;
          local_30 = (BuildCtx *)((long)&local_30->D + 1);
        }
        goto LAB_00106c01;
      case 0xf2:
      case 0xf9:
        local_58 = pbVar11;
        goto LAB_00106c01;
      case 0xf3:
        goto switchD_00106c88_caseD_f3;
      case 0xf4:
        local_58 = local_58 + 2;
        if (-1 < (int)local_a4) goto LAB_00107110;
        local_48 = local_48 + 1;
        local_68 = (uint)*(undefined8 *)(*(long *)(lVar1 + 0x30) + (long)(int)-local_a4 * 8);
        pbVar11 = local_58;
        goto switchD_00106c88_caseD_f3;
      case 0xf5:
        local_58 = pbVar11;
LAB_00107110:
        puVar12 = local_48 + 1;
        uVar6 = *local_48;
        piVar9 = (int *)(*(long *)(lVar1 + 0x50 + (long)((int)local_a4 >> 0x18) * 0x28) +
                        (long)(int)local_a4 * 4);
        local_48 = puVar12;
        if (-1 < *piVar9) {
          local_68 = *piVar9 - ((((int)local_30 - (int)in_RSI) + 4) - uVar6);
          if (uVar6 != 0) {
            if (uVar6 == 4) {
              pBVar8 = (BuildCtx *)((long)&local_30[-1].reloc[199].type + 3);
              *(char *)((long)&local_30[-1].reloc[199].type + 2) = *(char *)&pBVar8->D + -0x10;
              local_30 = pBVar8;
            }
            else {
              *(undefined1 *)((long)&local_30[-1].reloc[199].type + 3) = 0xeb;
            }
            goto LAB_00106d48;
          }
          break;
        }
        local_68 = piVar9[1];
        goto LAB_001070f1;
      case 0xf6:
        pbVar11 = local_58 + 2;
        if (-1 < (int)local_a4) goto switchD_00106c88_caseD_f7;
        local_68 = (uint)*(undefined8 *)(*(long *)(lVar1 + 0x30) + (long)(int)-local_a4 * 8);
        local_58 = local_58 + 2;
        break;
      case 0xf7:
switchD_00106c88_caseD_f7:
        local_58 = pbVar11;
        piVar9 = (int *)(*(long *)(lVar1 + 0x50 + (long)((int)local_a4 >> 0x18) * 0x28) +
                        (long)(int)local_a4 * 4);
        if (*piVar9 < 0) {
          local_b4 = piVar9[1];
        }
        else {
          local_b4 = *piVar9 + (int)in_RSI;
        }
        local_68 = local_b4;
        break;
      case 0xf8:
        local_58 = local_58 + 2;
        if (9 < *pbVar11) {
          if (*local_58 == 0xf2) {
            local_a4 = *local_48;
          }
          *(long *)(*(long *)(lVar1 + 0x30) + (long)(int)(uint)*pbVar11 * 8) =
               (long)&in_RSI->D + (long)(int)local_a4;
          in_stack_ffffffffffffff3c = local_a4;
          in_stack_ffffffffffffff40 = in_RSI;
        }
        goto LAB_00106c01;
      case 0xfa:
        local_58 = local_58 + 2;
        bVar5 = *pbVar11;
        for (; ((long)local_30 - (long)in_RSI & (long)(int)(uint)bVar5) != 0;
            local_30 = (BuildCtx *)((long)&local_30->D + 1)) {
          *(undefined1 *)&local_30->D = 0x90;
        }
        goto LAB_00106c01;
      case 0xfb:
        local_68 = collect_reloc(in_stack_ffffffffffffff40,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0,
                                 0x1073e9);
        local_58 = local_58 + 3;
        break;
      case 0xfc:
        local_64 = *pbVar11;
        pbVar11 = local_58 + 2;
        goto LAB_00107427;
      case 0xfd:
        goto switchD_00106c88_caseD_fd;
      case 0xfe:
      case 0xff:
        goto LAB_0010744f;
      }
      goto LAB_00106dbd;
    }
    local_34 = local_34 + 1;
  } while( true );
LAB_0010744f:
  goto LAB_00106bb7;
switchD_00106c88_caseD_fd:
  local_60 = local_30;
  local_58 = pbVar11;
  goto LAB_00106c01;
switchD_00106c88_caseD_f3:
  local_58 = pbVar11;
LAB_001070f1:
  local_68 = local_68 - ((int)local_30 + 4);
LAB_00106dbd:
  *(char *)&local_30->D = (char)local_68;
  *(char *)((long)&local_30->D + 1) = (char)(local_68 >> 8);
  *(char *)((long)&local_30->D + 2) = (char)(local_68 >> 0x10);
  *(char *)((long)&local_30->D + 3) = (char)(local_68 >> 0x18);
  local_30 = (BuildCtx *)((long)&local_30->D + 4);
  goto LAB_00106c01;
switchD_00106c88_caseD_ed:
  local_58 = pbVar11;
  goto LAB_00106dbd;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n];
	  /* fallthrough */
	case DASM_REL_A: rel_a: n -= (int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++; if (n < 0) { n = (int)(ptrdiff_t)D->globals[-n]; goto wd; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  n = *pb < 0 ? pb[1] : (*pb + (int)(ptrdiff_t)base);
	  goto wd;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}